

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O1

void __thiscall
ear::GainCalculatorHOAImpl::GainCalculatorHOAImpl(GainCalculatorHOAImpl *this,Layout *layout)

{
  undefined8 *puVar1;
  bool *__ptr;
  void *pvVar2;
  size_type sVar3;
  Index IVar4;
  Index IVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  Index size;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  shared_ptr<ear::PointSourcePanner> panner;
  Array<bool,__1,_1,_0,__1,_1> local_100;
  ulong local_f0;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  DenseStorage<double,__1,__1,_3,_0> local_c0;
  undefined8 *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  Layout local_a0;
  
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (bool *)0x0;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows = 0
  ;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  Layout::withoutLfe(&local_a0,layout);
  configurePolarPanner((ear *)&local_b0,&local_a0);
  if (local_a0._screen.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &local_a0._screen.super_type.m_storage);
    local_a0._screen.super_type.m_initialized = false;
  }
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_a0._channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._name._M_dataplus._M_p != &local_a0._name.field_2) {
    operator_delete(local_a0._name._M_dataplus._M_p,local_a0._name.field_2._M_allocated_capacity + 1
                   );
  }
  Layout::isLfe((vector<bool,_std::allocator<bool>_> *)&local_a0,layout);
  local_e8.m_data =
       (double *)
       ((ulong)(uint)local_a0._name.field_2._8_4_ +
       (local_a0._name.field_2._M_allocated_capacity - (long)local_a0._name._M_dataplus._M_p) * 8);
  Eigen::Array<bool,_-1,_1,_0,_-1,_1>::Array<long>(&local_100,(long *)&local_e8);
  if (0 < (long)local_e8.m_data) {
    pdVar9 = (double *)0x0;
    do {
      if (local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)pdVar9) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                     );
      }
      local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [(long)pdVar9] =
           (*(ulong *)(local_a0._name._M_dataplus._M_p + ((ulong)pdVar9 >> 6) * 8) >>
            ((ulong)pdVar9 & 0x3f) & 1) != 0;
      pdVar9 = (double *)((long)pdVar9 + 1);
    } while (local_e8.m_data != pdVar9);
  }
  __ptr = (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pvVar2 = (void *)(this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data = __ptr;
  local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)pvVar2;
  free(__ptr);
  if ((double *)local_a0._name._M_dataplus._M_p != (double *)0x0) {
    operator_delete(local_a0._name._M_dataplus._M_p,
                    (long)local_a0._channels.
                          super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_a0._name._M_dataplus._M_p);
    local_a0._name._M_dataplus._M_p = (pointer)0x0;
    local_a0._name._M_string_length = local_a0._name._M_string_length & 0xffffffff00000000;
    local_a0._name.field_2._M_allocated_capacity = 0;
    local_a0._name.field_2._8_4_ = 0;
    local_a0._channels.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  hoa::load_points();
  pdVar9 = (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
           m_data;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)local_a0._name._M_dataplus._M_p;
  sVar3 = (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows =
       local_a0._name._M_string_length;
  local_a0._name._M_dataplus._M_p = (pointer)pdVar9;
  local_a0._name._M_string_length = sVar3;
  free(pdVar9);
  Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
            (&local_c0,(DenseStorage<double,__1,__1,_3,_0> *)this);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
    }
  }
  local_a0._name._M_dataplus._M_p = (pointer)0x0;
  local_a0._name._M_string_length = 0x3ff0000000000000;
  local_a0._name.field_2._M_allocated_capacity = 0;
  local_c8 = local_a8;
  (**(code **)*local_b0)(&local_100,local_b0);
  uVar10 = local_f0;
  if ((char)local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
      == '\0') {
LAB_0013c427:
    __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                  "reference_type boost::optional<Eigen::Matrix<double, -1, 1>>::get() [T = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  free((void *)local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  local_e8.m_cols = 0;
  if ((long)(local_c0.m_rows | uVar10) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((local_c0.m_rows != 0 && uVar10 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_c0.m_rows),0) <
      (long)uVar10)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = std::random_device::_M_fini;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_e8,local_c0.m_rows * uVar10,uVar10,local_c0.m_rows);
  if (0 < local_c0.m_rows) {
    lVar8 = 0;
    lVar13 = 0;
    do {
      local_a0._name._M_dataplus._M_p = (pointer)local_c0.m_data[lVar13];
      local_a0._name._M_string_length = (size_type)local_c0.m_data[lVar13 + local_c0.m_rows];
      local_a0._name.field_2._M_allocated_capacity =
           (size_type)local_c0.m_data[lVar13 + local_c0.m_rows * 2];
      (**(code **)*local_b0)(&local_100,local_b0,&local_a0);
      if ((char)local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
                m_data == '\0') goto LAB_0013c427;
      if (local_e8.m_rows < 0 && local_e8.m_data != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (local_e8.m_cols <= lVar13) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if (local_e8.m_rows != local_f0) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                      ,0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
                     );
      }
      uVar10 = local_e8.m_rows;
      if ((((ulong)(local_e8.m_data + local_e8.m_rows * lVar13) & 7) == 0) &&
         (uVar10 = (ulong)((uint)((ulong)(local_e8.m_data + local_e8.m_rows * lVar13) >> 3) & 1),
         local_e8.m_rows <= (long)uVar10)) {
        uVar10 = local_e8.m_rows;
      }
      if (0 < (long)uVar10) {
        uVar11 = 0;
        do {
          *(undefined8 *)((long)local_e8.m_data + uVar11 * 8 + local_e8.m_rows * lVar8) =
               *(undefined8 *)
                (local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      lVar12 = local_e8.m_rows - uVar10;
      uVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
      if (1 < lVar12) {
        do {
          puVar7 = (undefined8 *)
                   (local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows + uVar10 * 8);
          uVar6 = puVar7[1];
          puVar1 = (undefined8 *)((long)local_e8.m_data + uVar10 * 8 + local_e8.m_rows * lVar8);
          *puVar1 = *puVar7;
          puVar1[1] = uVar6;
          uVar10 = uVar10 + 2;
        } while ((long)uVar10 < (long)uVar11);
      }
      if ((long)uVar11 < local_e8.m_rows) {
        do {
          *(undefined8 *)((long)local_e8.m_data + uVar11 * 8 + local_e8.m_rows * lVar8) =
               *(undefined8 *)
                (local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (local_e8.m_rows != uVar11);
      }
      if ((char)local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
                m_data == '\x01') {
        free((void *)local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows);
        local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (bool *)((ulong)local_100.super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data & 0xffffffffffffff00);
      }
      lVar13 = lVar13 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar13 < local_c0.m_rows);
  }
  pdVar9 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_e8.m_data;
  IVar4 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_e8.m_rows;
  IVar5 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_e8.m_cols;
  local_e8.m_data = pdVar9;
  local_e8.m_rows = IVar4;
  local_e8.m_cols = IVar5;
  free(pdVar9);
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  free(local_c0.m_data);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  return;
}

Assistant:

GainCalculatorHOAImpl::GainCalculatorHOAImpl(const Layout &layout) {
    std::shared_ptr<PointSourcePanner> panner =
        configurePolarPanner(layout.withoutLfe());
    is_lfe = copy_vector<decltype(is_lfe)>(layout.isLfe());
    points = hoa::load_points();
    G_virt = hoa::calc_G_virt(
        points, [panner](Eigen::Vector3d pos) { return panner->handle(pos); });
  }